

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O2

Container * __thiscall
scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
construct<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Container *__return_storage_ptr__,
          VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end)

{
  Node local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; this != (VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node> *)
                 begin._M_current; this = this + 8) {
    local_68.name = *(unsigned_long *)this;
    local_68.dual_edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.dual_edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.dual_edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.edges.
    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.visited = false;
    std::
    vector<Graph<unsigned_long,scc::VectorType>::Node,std::allocator<Graph<unsigned_long,scc::VectorType>::Node>>
    ::emplace_back<Graph<unsigned_long,scc::VectorType>::Node>
              ((vector<Graph<unsigned_long,scc::VectorType>::Node,std::allocator<Graph<unsigned_long,scc::VectorType>::Node>>
                *)__return_storage_ptr__,&local_68);
    Graph<unsigned_long,_scc::VectorType>::Node::~Node(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

static Container construct(Iter begin, Iter end) {
            Container nodes{};
            for (auto i = begin; i != end; i = std::next(i)) {
                nodes.push_back(N{*i});
            }
            return nodes;
        }